

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeIdentifier
          (ParserImpl *this,string *identifier)

{
  TokenType TVar1;
  bool bVar2;
  string_view message;
  undefined1 local_90 [80];
  AlphaNum local_40;
  
  TVar1 = (this->tokenizer_).current_.type;
  if (TVar1 == TYPE_IDENTIFIER) {
LAB_002cb632:
    std::__cxx11::string::_M_assign((string *)identifier);
    io::Tokenizer::Next(&this->tokenizer_);
    bVar2 = true;
  }
  else {
    if ((this->allow_field_number_ == false) && (this->allow_unknown_field_ == false)) {
      if ((TVar1 == TYPE_INTEGER) && (this->allow_unknown_extension_ != false)) goto LAB_002cb632;
    }
    else if (TVar1 == TYPE_INTEGER) goto LAB_002cb632;
    local_40.piece_ = absl::lts_20240722::NullSafeStringView("Expected identifier, got: ");
    local_90._40_8_ = (this->tokenizer_).current_.text._M_dataplus._M_p;
    local_90._32_8_ = (this->tokenizer_).current_.text._M_string_length;
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_90,&local_40);
    message._M_str = (char *)local_90._0_8_;
    message._M_len = local_90._8_8_;
    ReportError(this,message);
    std::__cxx11::string::~string((string *)local_90);
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool ConsumeIdentifier(std::string* identifier) {
    if (LookingAtType(io::Tokenizer::TYPE_IDENTIFIER)) {
      *identifier = tokenizer_.current().text;
      tokenizer_.Next();
      return true;
    }

    // If allow_field_number_ or allow_unknown_field_ is true, we should able
    // to parse integer identifiers.
    if ((allow_field_number_ || allow_unknown_field_ ||
         allow_unknown_extension_) &&
        LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
      *identifier = tokenizer_.current().text;
      tokenizer_.Next();
      return true;
    }

    ReportError(
        absl::StrCat("Expected identifier, got: ", tokenizer_.current().text));
    return false;
  }